

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O2

QPromise<void> QtPromise::resolve(void)

{
  QSharedData *pQVar1;
  PromiseData<void> *this;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> extraout_RDX;
  _func_int **in_RDI;
  QPromise<void> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_48;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_40;
  PromiseResolver<void> resolver;
  QPromiseBase<void> local_30;
  
  *in_RDI = (_func_int *)&PTR__QPromiseBase_00128920;
  this = (PromiseData<void> *)operator_new(0x58);
  (this->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this);
  in_RDI[1] = (_func_int *)this;
  LOCK();
  pQVar1 = &(this->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_30.m_d.d = (PromiseData<void> *)in_RDI[1];
  if (local_30.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_30.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_30._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128980;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_30);
  QPromiseBase<void>::~QPromiseBase(&local_30);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_40.d = (Data *)0x0;
  local_48 = resolver.m_d.d;
  QtPromisePrivate::PromiseResolver<void>::resolve((PromiseResolver<void> *)&local_48);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_48);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_40);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  *in_RDI = (_func_int *)&PTR__QPromiseBase_00128980;
  QVar2.super_QPromiseBase<void>.m_d.d = extraout_RDX.d;
  QVar2.super_QPromiseBase<void>._vptr_QPromiseBase = in_RDI;
  return (QPromise<void>)QVar2.super_QPromiseBase<void>;
}

Assistant:

static inline QPromise<void> resolve()
{
    return QPromise<void>{[](const QPromiseResolve<void>& resolve) {
        resolve();
    }};
}